

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O3

void Bmc_CexCarePropagateFwd(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vPriosIn,Vec_Int_t *vPriosFf)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  
  iVar13 = pCex->iFrame;
  iVar8 = (iVar13 + 1) * pCex->nPis;
  if (iVar8 < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar9 = iVar8 * 2;
  pGVar4 = p->pObjs;
  pGVar4->Value = uVar9;
  lVar11 = (long)p->nRegs;
  if (0 < lVar11) {
    pVVar5 = p->vCos;
    iVar8 = pVVar5->nSize;
    uVar12 = (ulong)(uint)(iVar8 - p->nRegs);
    do {
      if (((int)uVar12 < 0) || (iVar8 <= (int)uVar12)) {
LAB_0057af68:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = pVVar5->pArray[uVar12];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_0057af49:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4[iVar10].Value = uVar9;
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  vPriosFf->nSize = 0;
  if (-1 < iVar13) {
    iVar13 = 0;
    do {
      iVar8 = p->nRegs;
      if (0 < iVar8) {
        iVar10 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar9 = (iVar1 - iVar8) + iVar10;
          if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) goto LAB_0057af68;
          iVar1 = p->vCos->pArray[uVar9];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0057af49;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar9 = (iVar2 - iVar8) + iVar10;
          if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) goto LAB_0057af68;
          uVar9 = p->vCis->pArray[uVar9];
          if (((long)(int)uVar9 < 0) || ((uint)p->nObjs <= uVar9)) goto LAB_0057af49;
          uVar3 = pGVar4[iVar1].Value;
          pGVar4[(int)uVar9].Value = uVar3;
          uVar9 = vPriosFf->nSize;
          if (uVar9 == vPriosFf->nCap) {
            if ((int)uVar9 < 0x10) {
              if (vPriosFf->pArray == (int *)0x0) {
                piVar7 = (int *)malloc(0x40);
              }
              else {
                piVar7 = (int *)realloc(vPriosFf->pArray,0x40);
              }
              vPriosFf->pArray = piVar7;
              if (piVar7 == (int *)0x0) {
LAB_0057af87:
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              vPriosFf->nCap = 0x10;
            }
            else {
              if (vPriosFf->pArray == (int *)0x0) {
                piVar7 = (int *)malloc((ulong)uVar9 * 8);
              }
              else {
                piVar7 = (int *)realloc(vPriosFf->pArray,(ulong)uVar9 * 8);
              }
              vPriosFf->pArray = piVar7;
              if (piVar7 == (int *)0x0) goto LAB_0057af87;
              vPriosFf->nCap = uVar9 * 2;
            }
          }
          else {
            piVar7 = vPriosFf->pArray;
          }
          iVar8 = vPriosFf->nSize;
          vPriosFf->nSize = iVar8 + 1;
          piVar7[iVar8] = uVar3;
          iVar10 = iVar10 + 1;
          iVar8 = p->nRegs;
        } while (iVar10 < iVar8);
      }
      Bmc_CexCarePropagateFwdOne(p,pCex,iVar13,vPriosIn);
      bVar6 = iVar13 < pCex->iFrame;
      iVar13 = iVar13 + 1;
    } while (bVar6);
  }
  return;
}

Assistant:

void Bmc_CexCarePropagateFwd( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vPriosIn, Vec_Int_t * vPriosFf )
{
    Gia_Obj_t * pObjRo, * pObjRi;
    int i, f, ValueMax = Abc_Var2Lit( pCex->nPis * (pCex->iFrame + 1), 0 );
    Gia_ManConst0( p )->Value = ValueMax;
    Gia_ManForEachRi( p, pObjRi, i )
        pObjRi->Value = ValueMax;
    Vec_IntClear( vPriosFf );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            Vec_IntPush( vPriosFf, (pObjRo->Value = pObjRi->Value) );
        Bmc_CexCarePropagateFwdOne( p, pCex, f, vPriosIn );
    }
}